

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O0

ze_result_t zelTracerCreate(zel_tracer_desc_t *desc,zel_tracer_handle_t *phTracer)

{
  zel_pfnTracerCreate_t pfnCreate;
  zel_tracer_handle_t *phTracer_local;
  zel_tracer_desc_t *desc_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    if (*(code **)(ze_lib::context + 0x28) == (code *)0x0) {
      desc_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    else {
      desc_local._4_4_ = (**(code **)(ze_lib::context + 0x28))(desc,phTracer);
    }
  }
  else {
    desc_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return desc_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerCreate(
    const zel_tracer_desc_t* desc,              ///< [in] pointer to tracer descriptor
    zel_tracer_handle_t* phTracer               ///< [out] pointer to handle of tracer object created
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnCreate = ze_lib::context->zelTracingDdiTable.Tracer.pfnCreate;
    if( nullptr == pfnCreate )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnCreate( desc, phTracer );
}